

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> * __thiscall
wasm::WATParser::anon_unknown_0::ident
          (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *__return_storage_ptr__,
          anon_unknown_0 *this,string_view in)

{
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__other;
  undefined1 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 uVar4;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *extraout_RAX;
  optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *extraout_RAX_00;
  bool *__return_storage_ptr___00;
  string_view in_00;
  string_view in_01;
  string_view sv;
  string_view in_02;
  string_view str;
  undefined1 local_d8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_1;
  LexIdCtx ctx;
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> s;
  char *extraout_RDX;
  
  ctx.super_LexCtx.input._M_len = in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  ctx.super_LexCtx.lexedSize._0_1_ = 0;
  ctx.str.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_1_ = 0;
  sv._M_str = "$";
  sv._M_len = 1;
  lexed_1.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._16_8_
       = this;
  uVar4 = LexCtx::startsWith((LexCtx *)
                             &lexed_1.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                              ._M_engaged,sv);
  if ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)uVar4 ==
      (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)0x0) {
LAB_00b7da23:
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_engaged =
         false;
  }
  else {
    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 1;
    in_02._M_len = lexed_1.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _16_8_ - (long)ctx.super_LexCtx.input._M_str;
    if ((ulong)lexed_1.
               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
               _M_payload.
               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
               _16_8_ < ctx.super_LexCtx.input._M_str) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    in_02._M_str = ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len;
    __return_storage_ptr___00 =
         &ctx.str.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged;
    anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                        __return_storage_ptr___00,in_02);
    if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._M_value.str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._40_1_ != '\0') {
        __return_storage_ptr___00 =
             (bool *)((long)&s.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                             ._M_payload.
                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                             .
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                             ._M_payload + 0x10);
      }
      __other = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&s.
                           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                           ._M_payload.
                           super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                           .
                           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                           ._M_payload._M_value.super_LexResult + 8);
      p_Var5 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&s;
      if (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._40_1_ != '\0') {
        p_Var5 = __other;
      }
      str._M_str = extraout_RDX;
      str._M_len = (size_t)(p_Var5->_M_payload)._M_value._M_dataplus._M_p;
      bVar3 = String::isUTF8(*(String **)__return_storage_ptr___00,str);
      uVar4 = CONCAT71(extraout_var,bVar3);
      if (bVar3) {
        ctx.super_LexCtx.lexedSize._0_1_ = 1;
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&ctx.isStr,__other);
        ctx.super_LexCtx.input._M_str =
             ctx.super_LexCtx.input._M_str +
             ctx.str.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_;
LAB_00b7d94f:
        if ((s.
             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
             .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
             _M_payload._M_value.str.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged == true) &&
           (s.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
            ._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
            _M_payload._M_value.str.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = false,
           s.
           super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
           _M_payload.
           super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
           .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
           _M_payload._40_1_ == '\x01')) {
          s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._40_1_ = 0;
          if ((void *)CONCAT71(s.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                               .
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                               ._M_payload._9_7_,
                               s.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                               .
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                               ._M_payload._8_1_) !=
              (void *)((long)&s.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                              ._M_payload.
                              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                              .
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                              ._M_payload + 0x18)) {
            operator_delete((void *)CONCAT71(s.
                                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                             ._M_payload._9_7_,
                                             s.
                                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                             ._M_payload.
                                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                             .
                                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                             ._M_payload._8_1_),
                            s.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                            ._M_payload.
                            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                            ._M_payload._24_8_ + 1);
          }
        }
        bVar3 = LexCtx::canFinish((LexCtx *)
                                  &lexed_1.
                                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                                   ._M_engaged);
        uVar4 = (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
                CONCAT71(extraout_var_00,bVar3);
        if ((bVar3) &&
           (uVar4 = ctx.super_LexCtx.input._M_str, ctx.super_LexCtx.input._M_str != (char *)0x0)) {
          ctx.str.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = ctx.super_LexCtx.input._M_str;
          if ((ulong)lexed_1.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                     ._16_8_ < ctx.super_LexCtx.input._M_str) {
            ctx.str.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._32_8_ = lexed_1.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._16_8_;
          }
          s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._M_value.super_LexResult.span._M_len = ctx.super_LexCtx.input._M_len;
          uVar4 = CONCAT71((int7)((ulong)ctx.str.
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._32_8_ >> 8),(undefined1)ctx.super_LexCtx.lexedSize);
          s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._8_1_ = (undefined1)ctx.super_LexCtx.lexedSize;
          s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
          _M_payload._M_value.str.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          if (ctx.str.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._24_1_ == '\x01') {
            puVar1 = (undefined1 *)
                     ((long)&s.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                             ._M_payload.
                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                             .
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                             ._M_payload + 0x20);
            s.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
            ._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
            _M_payload._16_8_ = puVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       ((long)&s.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                               .
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                               ._M_payload + 0x10),ctx._24_8_,
                       (long)ctx.str.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload._M_value._M_dataplus._M_p + ctx._24_8_);
            (__return_storage_ptr__->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>)
            ._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
            _M_payload._M_value.super_LexResult.span._M_len =
                 ctx.str.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._32_8_;
            *(size_t *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload._M_value.super_LexResult.span + 8) =
                 s.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._M_value.super_LexResult.span._M_len;
            (__return_storage_ptr__->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>)
            ._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
            _M_payload._M_value.isStr =
                 (bool)s.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                       ._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                       ._M_payload._8_1_;
            puVar2 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                             )._M_payload.
                             super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                             .
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                             ._M_payload + 0x28);
            *(undefined8 **)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload + 0x18) = puVar2;
            if ((undefined1 *)
                s.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                ._M_payload.
                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
                _M_payload._16_8_ == puVar1) {
              *puVar2 = s.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                        ._M_payload.
                        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                        .
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                        ._M_payload._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                                )._M_payload.
                                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                                .
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                                ._M_payload + 0x30) =
                   CONCAT71(s.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                            ._M_payload.
                            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                            ._M_payload._41_7_,
                            s.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                            ._M_payload.
                            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                            ._M_payload._40_1_);
            }
            else {
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                       )._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                       ._M_payload + 0x18) =
                   s.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._16_8_;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                       )._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                       ._M_payload + 0x28) =
                   s.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._32_8_;
            }
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload + 0x20) =
                 s.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                 ._M_payload.
                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                 .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                 ._M_payload._24_8_;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload + 0x38) = 1;
            uVar4 = s.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                    ._M_payload.
                    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                    .
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                    ._M_payload._24_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
              )._M_payload.
              super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
              .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
              _M_payload = ctx.str.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._32_8_;
            *(size_t *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload._M_value.super_LexResult.span + 8) = ctx.super_LexCtx.input._M_len;
            (__return_storage_ptr__->
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>)
            ._M_payload.
            super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
            .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
            _M_payload._M_value.isStr = (bool)(undefined1)ctx.super_LexCtx.lexedSize;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     )._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._M_payload + 0x38) = 0;
          }
          (__return_storage_ptr__->
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
          _M_payload.
          super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
          .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
          _M_engaged = true;
          goto LAB_00b7db49;
        }
        goto LAB_00b7da23;
      }
    }
    else {
      if ((ulong)lexed_1.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _16_8_ < ctx.super_LexCtx.input._M_str) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
      in_00._M_len = ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len;
      in_00._M_str = (char *)lexed_1.
                             super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                             ._16_8_;
      uVar4 = idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_d8,
                     (anon_unknown_0 *)
                     (lexed_1.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                      ._16_8_ - (long)ctx.super_LexCtx.input._M_str),in_00);
      if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
          _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
          ._M_payload._8_1_ == '\x01') {
        ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + (long)local_d8;
        if (ctx.super_LexCtx.input._M_str <=
            (ulong)lexed_1.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                   _16_8_) {
          do {
            in_01._M_str = (anon_unknown_0 *)
                           (lexed_1.
                            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                            ._16_8_ - (long)ctx.super_LexCtx.input._M_str);
            in_01._M_len = ctx.super_LexCtx.input._M_str + ctx.super_LexCtx.input._M_len;
            idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                   &lexed.
                    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                    _M_engaged,in_01._M_str,in_01);
            if (lexed_1.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
                _M_payload.
                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                _M_payload._8_1_ == '\0') goto LAB_00b7d94f;
            ctx.super_LexCtx.input._M_str =
                 ctx.super_LexCtx.input._M_str +
                 lexed.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _16_8_;
          } while (ctx.super_LexCtx.input._M_str <=
                   (ulong)lexed_1.
                          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>
                          ._16_8_);
        }
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
    }
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>).
    _M_payload.
    super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
    .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>._M_engaged =
         false;
    if ((s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
         _M_payload.
         super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
         .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
         _M_payload._M_value.str.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_engaged == true) &&
       (s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._M_value.str.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged = false,
       s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
       _M_payload.
       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
       .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
       _M_payload._40_1_ == '\x01')) {
      uVar4 = (long)&s.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                     ._M_payload + 0x18;
      s.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_payload
      ._40_1_ = 0;
      if ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
          CONCAT71(s.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._9_7_,
                   s.
                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                   ._M_payload._8_1_) !=
          (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)uVar4) {
        operator_delete((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)
                        CONCAT71(s.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                 ._M_payload._9_7_,
                                 s.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                 ._M_payload._8_1_),
                        s.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                        ._M_payload.
                        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                        .
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                        ._M_payload._24_8_ + 1);
        uVar4 = extraout_RAX;
      }
    }
  }
LAB_00b7db49:
  if (ctx.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ == '\x01') {
    uVar4 = (long)&ctx.str.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 8;
    ctx.str.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    if (ctx._24_8_ != uVar4) {
      operator_delete((void *)ctx._24_8_,
                      ctx.str.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length + 1);
      uVar4 = extraout_RAX_00;
    }
  }
  return (optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)uVar4;
}

Assistant:

std::optional<LexIdResult> ident(std::string_view in) {
  LexIdCtx ctx(in);
  if (!ctx.takePrefix("$"sv)) {
    return {};
  }
  if (auto s = str(ctx.next())) {
    if (!String::isUTF8(s->getStr())) {
      return {};
    }
    ctx.isStr = true;
    ctx.str = s->str;
    ctx.take(*s);
  } else if (auto lexed = idchar(ctx.next())) {
    ctx.take(*lexed);
    while (auto lexed = idchar(ctx.next())) {
      ctx.take(*lexed);
    }
  } else {
    return {};
  }
  if (ctx.canFinish()) {
    return ctx.lexed();
  }
  return {};
}